

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bounds_checks.h
# Opt level: O1

void * memcpy(void *__dest,void *__src,size_t __n)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *pDVar4;
  void *pvVar5;
  long lVar6;
  ulong uVar7;
  
  if (__n != 0) {
    pDVar4 = &snmalloc::
              FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
              ::default_value;
    if (snmalloc::
        BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
        ::concretePagemap.body_opt !=
        (DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *)
        0x0) {
      pDVar4 = (DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                *)((long)&((snmalloc::
                            BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                            ::concretePagemap.body_opt)->
                          super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                          ).super_MetaEntryBase.meta + ((ulong)__dest >> 10 & 0xfffffffffffffff0));
    }
    uVar7 = (ulong)(((uint)(pDVar4->
                           super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                           ).super_MetaEntryBase.remote_and_sizeclass & 0x7f) << 5);
    if ((*(long *)(snmalloc::sizeclass_metadata + uVar7) -
        (*(ulong *)(snmalloc::sizeclass_metadata + uVar7 + 8) & (ulong)__dest)) +
        (*(long *)(snmalloc::sizeclass_metadata + uVar7 + 0x10) *
         (*(ulong *)(snmalloc::sizeclass_metadata + uVar7 + 8) & (ulong)__dest) >> 0x36) *
        *(long *)(snmalloc::sizeclass_metadata + uVar7) < __n) {
      pvVar5 = snmalloc::report_fatal_bounds_error<void*>
                         (__dest,__n,"memcpy with destination out of bounds of heap allocation");
      return pvVar5;
    }
  }
  if (__n < 0x11) {
    switch(__n) {
    case 1:
      *(undefined1 *)__dest = *__src;
      break;
    case 2:
      *(undefined2 *)__dest = *__src;
      break;
    case 3:
      *(undefined2 *)__dest = *__src;
      *(undefined1 *)((long)__dest + 2) = *(undefined1 *)((long)__src + 2);
      break;
    case 4:
      *(undefined4 *)__dest = *__src;
      break;
    case 5:
      *(undefined4 *)__dest = *__src;
      *(undefined1 *)((long)__dest + 4) = *(undefined1 *)((long)__src + 4);
      break;
    case 6:
      *(undefined4 *)__dest = *__src;
      *(undefined2 *)((long)__dest + 4) = *(undefined2 *)((long)__src + 4);
      break;
    case 7:
      *(undefined4 *)__dest = *__src;
      *(undefined2 *)((long)__dest + 4) = *(undefined2 *)((long)__src + 4);
      *(undefined1 *)((long)__dest + 6) = *(undefined1 *)((long)__src + 6);
      break;
    case 8:
      *(undefined8 *)__dest = *__src;
      break;
    case 9:
      *(undefined8 *)__dest = *__src;
      *(undefined1 *)((long)__dest + 8) = *(undefined1 *)((long)__src + 8);
      break;
    case 10:
      *(undefined8 *)__dest = *__src;
      *(undefined2 *)((long)__dest + 8) = *(undefined2 *)((long)__src + 8);
      break;
    case 0xb:
      *(undefined8 *)__dest = *__src;
      *(undefined2 *)((long)__dest + 8) = *(undefined2 *)((long)__src + 8);
      *(undefined1 *)((long)__dest + 10) = *(undefined1 *)((long)__src + 10);
      break;
    case 0xc:
      *(undefined8 *)__dest = *__src;
      *(undefined4 *)((long)__dest + 8) = *(undefined4 *)((long)__src + 8);
      break;
    case 0xd:
      *(undefined8 *)__dest = *__src;
      *(undefined4 *)((long)__dest + 8) = *(undefined4 *)((long)__src + 8);
      *(undefined1 *)((long)__dest + 0xc) = *(undefined1 *)((long)__src + 0xc);
      break;
    case 0xe:
      *(undefined8 *)__dest = *__src;
      *(undefined4 *)((long)__dest + 8) = *(undefined4 *)((long)__src + 8);
      *(undefined2 *)((long)__dest + 0xc) = *(undefined2 *)((long)__src + 0xc);
      break;
    case 0xf:
      *(undefined8 *)__dest = *__src;
      *(undefined4 *)((long)__dest + 8) = *(undefined4 *)((long)__src + 8);
      *(undefined2 *)((long)__dest + 0xc) = *(undefined2 *)((long)__src + 0xc);
      *(undefined1 *)((long)__dest + 0xe) = *(undefined1 *)((long)__src + 0xe);
      break;
    case 0x10:
      uVar3 = *(undefined8 *)((long)__src + 8);
      *(undefined8 *)__dest = *__src;
      *(undefined8 *)((long)__dest + 8) = uVar3;
    }
  }
  else if (__n < 0x200) {
    lVar6 = 0;
    do {
      uVar3 = ((undefined8 *)((long)__src + lVar6))[1];
      *(undefined8 *)((long)__dest + lVar6) = *(undefined8 *)((long)__src + lVar6);
      ((undefined8 *)((long)__dest + lVar6))[1] = uVar3;
      uVar7 = lVar6 + 0x20;
      lVar6 = lVar6 + 0x10;
    } while (uVar7 <= __n);
    puVar1 = (undefined8 *)((__n - 0x10) + (long)__src);
    uVar3 = puVar1[1];
    puVar2 = (undefined8 *)((__n - 0x10) + (long)__dest);
    *puVar2 = *puVar1;
    puVar2[1] = uVar3;
  }
  else {
    snmalloc::X86_64Arch::copy((X86_64Arch *)__src,(EVP_PKEY_CTX *)__dest,(EVP_PKEY_CTX *)__n);
  }
  return __dest;
}

Assistant:

SNMALLOC_FAST_PATH_INLINE auto check_bound(
    const void* ptr, size_t len, const char* msg, F f = []() {})
  {
    if constexpr (PerformCheck)
    {
      if (SNMALLOC_LIKELY(len != 0))
      {
        if (SNMALLOC_UNLIKELY(remaining_bytes<Config>(address_cast(ptr)) < len))
        {
          return report_fatal_bounds_error(ptr, len, msg);
        }
      }
    }
    else
    {
      UNUSED(ptr, len, msg);
    }
    return f();
  }